

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O3

void duckdb::MakeTimestampNsFun::GetFunctions(void)

{
  long in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_1e9;
  code *local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  code *local_1d0;
  LogicalType local_1c8 [24];
  LogicalType local_1b0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_198;
  LogicalType local_180 [24];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  ScalarFunction local_148;
  
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"make_timestamp_ns","");
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  if (local_168[0] != local_158) {
    operator_delete(local_168[0]);
  }
  duckdb::LogicalType::LogicalType(local_1b0,BIGINT);
  __l._M_len = 1;
  __l._M_array = local_1b0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_198,__l,&local_1e9);
  duckdb::LogicalType::LogicalType(local_1c8,TIMESTAMP_NS);
  local_1e0 = 0;
  local_1e8 = ExecuteMakeTimestampNs<long>;
  local_1d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_1d8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_180,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_148,&local_198,local_1c8,&local_1e8,0,0,0,0,local_180,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_148);
  local_148._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_148.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_148.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_148 + 0xb0U),(_Any_data *)((long)&local_148 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_180);
  if (local_1d8 != (code *)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,3);
  }
  duckdb::LogicalType::~LogicalType(local_1c8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_198);
  duckdb::LogicalType::~LogicalType(local_1b0);
  return;
}

Assistant:

ScalarFunctionSet MakeTimestampNsFun::GetFunctions() {
	ScalarFunctionSet operator_set("make_timestamp_ns");
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::TIMESTAMP_NS, ExecuteMakeTimestampNs<int64_t>));
	return operator_set;
}